

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_135799e::ResizeRealtimeTest::~ResizeRealtimeTest(ResizeRealtimeTest *this)

{
  (this->super_CodecTestWith3Params<libaom_test::TestMode,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__ResizeRealtimeTest_00f35730;
  (this->super_CodecTestWith3Params<libaom_test::TestMode,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  .
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__ResizeRealtimeTest_00f35788;
  (this->super_EncoderTest)._vptr_EncoderTest = (_func_int **)&PTR__ResizeRealtimeTest_00f357a8;
  std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>::
  ~vector(&this->frame_info_list_);
  libaom_test::EncoderTest::~EncoderTest(&this->super_EncoderTest);
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

~ResizeRealtimeTest() override = default;